

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QJsonDocument QJsonDocument::fromJson(QByteArray *json,QJsonParseError *error)

{
  bool bVar1;
  QCborValue *this;
  undefined4 *in_RDX;
  QJsonParseError *in_RSI;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> in_RDI;
  long in_FS_OFFSET;
  QJsonDocument *result;
  Parser parser;
  QCborValue val;
  Parser *json_00;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar2;
  Parser *this_00;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  json_00 = (Parser *)in_RDI._M_head_impl;
  this_00 = (Parser *)in_RDI._M_head_impl;
  memset(&local_48,0,0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaa;
  local_2c = 0xaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  this = (QCborValue *)QByteArray::constData((QByteArray *)0x1afe8e);
  QByteArray::size((QByteArray *)in_RSI);
  QJsonPrivate::Parser::Parser
            ((Parser *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),(char *)json_00
             ,(int)((ulong)this >> 0x20));
  ((QCborValue *)&json_00->head)->n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument((QJsonDocument *)0x1afec7);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonPrivate::Parser::parse(this_00,in_RSI);
  bVar1 = QCborValue::isArray((QCborValue *)0x1aff09);
  if ((bVar1) || (bVar1 = QCborValue::isMap((QCborValue *)0x1aff17), bVar1)) {
    std::make_unique<QJsonDocumentPrivate>();
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator=
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)this,
               (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               in_RDI._M_head_impl);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::~unique_ptr
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)this)
    ;
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x1aff4a);
    QCborValue::operator=(this,&(in_RDI._M_head_impl)->value);
  }
  else {
    bVar1 = QCborValue::isUndefined((QCborValue *)0x1aff63);
    if ((!bVar1) && (in_RDX != (undefined4 *)0x0)) {
      in_RDX[1] = 5;
      *in_RDX = 0;
    }
  }
  bVar2 = 1;
  QCborValue::~QCborValue(this);
  if ((bVar2 & 1) == 0) {
    ~QJsonDocument((QJsonDocument *)0x1affa8);
  }
  QJsonPrivate::Parser::~Parser((Parser *)0x1affb2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
         in_RDI._M_head_impl;
}

Assistant:

QJsonDocument QJsonDocument::fromJson(const QByteArray &json, QJsonParseError *error)
{
    QJsonPrivate::Parser parser(json.constData(), json.size());
    QJsonDocument result;
    const QCborValue val = parser.parse(error);
    if (val.isArray() || val.isMap()) {
        result.d = std::make_unique<QJsonDocumentPrivate>();
        result.d->value = val;
    } else if (!val.isUndefined() && error) {
        // parsed a valid string/number/bool/null,
        // but QJsonDocument only stores objects and arrays.
        error->error = QJsonParseError::IllegalValue;
        error->offset = 0;
    }
    return result;
}